

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

PolyKernel * __thiscall CoreML::Specification::Kernel::mutable_polykernel(Kernel *this)

{
  bool bVar1;
  PolyKernel *this_00;
  Kernel *this_local;
  
  bVar1 = has_polykernel(this);
  if (!bVar1) {
    clear_kernel(this);
    set_has_polykernel(this);
    this_00 = (PolyKernel *)operator_new(0x28);
    PolyKernel::PolyKernel(this_00);
    (this->kernel_).polykernel_ = this_00;
  }
  return (PolyKernel *)(this->kernel_).linearkernel_;
}

Assistant:

inline ::CoreML::Specification::PolyKernel* Kernel::mutable_polykernel() {
  if (!has_polykernel()) {
    clear_kernel();
    set_has_polykernel();
    kernel_.polykernel_ = new ::CoreML::Specification::PolyKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.polyKernel)
  return kernel_.polykernel_;
}